

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSearch.cpp
# Opt level: O1

NodeResult __thiscall HighsSearch::branch(HighsSearch *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  pointer pNVar5;
  HighsLpRelaxation *pHVar6;
  _Head_base<0UL,_HighsMipSolverData_*,_false> _Var7;
  HighsPseudocost *pHVar8;
  pointer ppVar9;
  pointer pdVar10;
  long lVar11;
  int *piVar12;
  pointer pHVar13;
  pointer pHVar14;
  double dVar15;
  bool bVar16;
  HighsInt HVar17;
  NodeResult NVar18;
  HighsLpRelaxation *__tmp;
  long lVar19;
  HighsMipSolver *pHVar20;
  vector<double,_std::allocator<double>_> *pvVar21;
  int iVar22;
  long lVar23;
  ulong uVar24;
  undefined1 *puVar25;
  undefined1 *puVar26;
  double *pdVar27;
  HighsDomain *localdomain;
  int *piVar28;
  int iVar29;
  int64_t maxSbIters;
  pointer __args;
  undefined4 uVar30;
  undefined4 uVar31;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined4 uVar35;
  undefined4 uVar36;
  HighsDomain *pHVar37;
  HighsDomain *pHVar38;
  HighsDomain *pHVar39;
  double upNodeLb;
  double downNodeLb;
  undefined1 local_5490 [24];
  string local_5478;
  HighsDomain *local_5458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_5450;
  double local_5440;
  undefined1 local_5438 [16];
  double local_5428;
  double local_5420;
  vector<double,_std::allocator<double>_> *local_5418;
  double *local_5410;
  double local_5408;
  pointer local_5400;
  undefined1 local_53f8 [16];
  HighsLpRelaxation local_53e8;
  
  (this->nodestack).
  super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].branchingdecision.column = -1;
  this->inbranching = true;
  uVar4 = this->pseudocost->minreliable;
  pHVar38 = (HighsDomain *)(ulong)uVar4;
  pNVar5 = (this->nodestack).
           super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_5490._0_8_ = pNVar5[-1].lower_bound;
  NVar18 = kOpen;
  if (pNVar5[-1].opensubtrees != '\x02') {
LAB_002e9070:
    this->inbranching = false;
    pHVar8 = this->pseudocost;
    pNVar5 = (this->nodestack).
             super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    pHVar8->minreliable = (HighsInt)pHVar38;
    pHVar8->degeneracyFactor = 1.0;
    if ((NVar18 != kSubOptimal) && (pNVar5[-1].opensubtrees == '\x02')) {
      if (pNVar5[-1].branchingdecision.column == -1) {
        pHVar8->degeneracyFactor = 1000000.0;
        _Var7._M_head_impl =
             (this->mipsolver->mipdata_)._M_t.
             super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
             _M_t.
             super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
             super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
        piVar28 = *(int **)&((_Var7._M_head_impl)->integral_cols).
                            super__Vector_base<int,_std::allocator<int>_>;
        piVar12 = *(pointer *)((long)&(_Var7._M_head_impl)->integral_cols + 8);
        if (piVar28 != piVar12) {
          local_5458 = &this->localdom;
          local_5440 = -1.0;
          do {
            pHVar38 = (HighsDomain *)0x3fe0000000000000;
            iVar29 = *piVar28;
            dVar15 = (this->localdom).col_upper_.super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar29];
            dVar1 = (this->localdom).col_lower_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start[iVar29];
            if (0.5 <= dVar15 - dVar1) {
              if (dVar1 <= -INFINITY) {
                if (dVar15 < INFINITY) {
                  pHVar38 = (HighsDomain *)(dVar15 + -0.5);
                }
              }
              else {
                pHVar38 = (HighsDomain *)(dVar1 + 0.5);
              }
              local_5490._8_8_ = pHVar38;
              dVar15 = HighsPseudocost::getScore(this->pseudocost,iVar29,(double)pHVar38);
              pHVar38 = local_5458;
              if (local_5440 < dVar15) {
                if ((this->lp->status - kOptimal & 0xfffffffd) == 0) {
                  pvVar21 = &(this->lp->lpsolver).solution_.col_dual;
                }
                else {
                  pvVar21 = &this->mipsolver->model_->col_cost_;
                }
                uVar30 = (undefined4)local_5490._8_8_;
                uVar31 = SUB84(local_5490._8_8_,4);
                dVar1 = (pvVar21->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start[iVar29];
                _Var7._M_head_impl =
                     (this->mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
                dVar2 = (_Var7._M_head_impl)->feastol;
                local_5428 = dVar15;
                if (ABS(dVar1) <= dVar2) {
LAB_002e921f:
                  dVar15 = (this->pseudocost->inferencesup).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar29];
                  dVar1 = (this->pseudocost->inferencesdown).
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[iVar29];
                  if (dVar15 <= dVar2 + dVar1) {
                    if (dVar1 - dVar2 <= dVar15) {
                      HighsDomain::getColLowerPos
                                (local_5458,iVar29,
                                 (HighsInt)
                                 ((ulong)((long)(this->localdom).domchgstack_.
                                                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->localdom).domchgstack_.
                                               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4),
                                 (HighsInt *)&local_53e8);
                      HighsDomain::getColUpperPos
                                (pHVar38,iVar29,
                                 (HighsInt)
                                 ((ulong)((long)(this->localdom).domchgstack_.
                                                super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(this->localdom).domchgstack_.
                                               super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4),
                                 (HighsInt *)&local_5478);
                      uVar30 = (undefined4)local_5490._8_8_;
                      uVar31 = SUB84(local_5490._8_8_,4);
                      bVar16 = (int)local_53e8.mipsolver <= (int)local_5478._M_dataplus._M_p;
                      goto LAB_002e92a4;
                    }
                    goto LAB_002e92bd;
                  }
LAB_002e92a8:
                  dVar15 = ceil((double)CONCAT44(uVar31,uVar30));
                  uVar30 = SUB84(dVar15,0);
                  uVar31 = (undefined4)((ulong)dVar15 >> 0x20);
                  pNVar5[-1].branching_point = dVar15;
                  pNVar5[-1].branchingdecision.boundtype = kLower;
                }
                else {
                  dVar15 = this->upper_limit;
                  uVar35 = SUB84(dVar15,0);
                  uVar36 = (undefined4)((ulong)dVar15 >> 0x20);
                  dVar3 = (_Var7._M_head_impl)->upper_limit;
                  if (dVar3 <= dVar15) {
                    uVar35 = SUB84(dVar3,0);
                    uVar36 = (undefined4)((ulong)dVar3 >> 0x20);
                  }
                  if ((double)CONCAT44(uVar36,uVar35) == INFINITY) goto LAB_002e921f;
                  bVar16 = 0.0 < dVar1;
LAB_002e92a4:
                  if (bVar16) goto LAB_002e92a8;
LAB_002e92bd:
                  dVar15 = floor((double)CONCAT44(uVar31,uVar30));
                  uVar30 = SUB84(dVar15,0);
                  uVar31 = (undefined4)((ulong)dVar15 >> 0x20);
                  pNVar5[-1].branching_point = dVar15;
                  pNVar5[-1].branchingdecision.boundtype = kUpper;
                }
                pNVar5[-1].branchingdecision.column = iVar29;
                pNVar5[-1].branchingdecision.boundval = (double)CONCAT44(uVar31,uVar30);
                local_5440 = local_5428;
              }
            }
            piVar28 = piVar28 + 1;
          } while (piVar28 != piVar12);
        }
        this->pseudocost->degeneracyFactor = 1.0;
      }
      if (pNVar5[-1].branchingdecision.column == -1) {
        if (this->lp->status == kOptimal) {
          pNVar5[-1].opensubtrees = '\0';
          NVar18 = kLpInfeasible;
        }
        else {
          HighsLpRelaxation::setIterationLimit(this->lp,0x7fffffff);
          HighsLpRelaxation::HighsLpRelaxation(&local_53e8,this->mipsolver);
          HighsLpRelaxation::loadModel(&local_53e8);
          Highs::changeColsBounds
                    ((Highs *)((long)&local_53e8 + 8),0,this->mipsolver->model_->num_col_ + -1,
                     (this->localdom).col_lower_.super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->localdom).col_upper_.super__Vector_base<double,_std::allocator<double>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          local_5490._8_8_ = this->lp;
          this->lp = &local_53e8;
          lVar19 = (long)&local_5478 + 0x10;
          local_5478._M_dataplus._M_p = (pointer)lVar19;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_5478,"presolve","");
          Highs::setOptionValue
                    ((Highs *)((long)&local_53e8 + 8),&local_5478,&::kHighsOnString_abi_cxx11_);
          if (local_5478._M_dataplus._M_p != (pointer)lVar19) {
            operator_delete(local_5478._M_dataplus._M_p);
          }
          NVar18 = evaluateNode(this);
          if (NVar18 == kOpen) {
            Highs::clearSolver(&this->lp->lpsolver);
            pHVar6 = this->lp;
            local_5478._M_dataplus._M_p = (pointer)lVar19;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_5478,"simplex_strategy","");
            Highs::setOptionValue(&pHVar6->lpsolver,&local_5478,4);
            if (local_5478._M_dataplus._M_p != (pointer)lVar19) {
              operator_delete(local_5478._M_dataplus._M_p);
            }
            NVar18 = evaluateNode(this);
            pHVar6 = this->lp;
            local_5478._M_dataplus._M_p = (pointer)lVar19;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_5478,"simplex_strategy","");
            Highs::setOptionValue(&pHVar6->lpsolver,&local_5478,1);
            if (local_5478._M_dataplus._M_p != (pointer)lVar19) {
              operator_delete(local_5478._M_dataplus._M_p);
            }
            if (NVar18 == kOpen) {
              Highs::clearSolver(&this->lp->lpsolver);
              pHVar6 = this->lp;
              local_5478._M_dataplus._M_p = (pointer)lVar19;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_5478,"solver","");
              Highs::setOptionValue(&pHVar6->lpsolver,&local_5478,"ipm");
              if (local_5478._M_dataplus._M_p != (pointer)lVar19) {
                operator_delete(local_5478._M_dataplus._M_p);
              }
              NVar18 = evaluateNode(this);
              if (NVar18 == kOpen) {
                highsLogUser(&(this->mipsolver->options_mip_->super_HighsOptionsStruct).log_options,
                             kWarning,
                             "Failed to solve node with all integer columns fixed. Declaring node infeasible.\n"
                            );
                pNVar5[-1].opensubtrees = '\0';
                NVar18 = kLpInfeasible;
              }
            }
          }
          this->lp = (HighsLpRelaxation *)local_5490._8_8_;
          HighsLpRelaxation::~HighsLpRelaxation(&local_53e8);
        }
      }
      else {
        local_5490._8_8_ = &this->nodestack;
        pHVar13 = (this->localdom).domchgstack_.
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pHVar14 = (this->localdom).domchgstack_.
                  super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
                  super__Vector_impl_data._M_start;
        bVar16 = orbitsValidInChildNode(this,&pNVar5[-1].branchingdecision);
        HighsDomain::changeBound(&this->localdom,pNVar5[-1].branchingdecision,(Reason)0xffffffff);
        pNVar5[-1].opensubtrees = '\x01';
        __args = pNVar5 + -1;
        if (pNVar5[-1].lower_bound <= (double)local_5490._0_8_) {
          __args = (pointer)local_5490;
        }
        if (bVar16) {
          local_53e8.mipsolver =
               (HighsMipSolver *)
               pNVar5[-1].stabilizerOrbits.
               super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_53e8.lpsolver._vptr_Highs =
               (_func_int **)
               pNVar5[-1].stabilizerOrbits.
               super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_53e8.lpsolver._vptr_Highs !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_53e8.lpsolver._vptr_Highs)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_53e8.lpsolver._vptr_Highs)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_53e8.lpsolver._vptr_Highs)->
              _M_use_count = ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             local_53e8.lpsolver._vptr_Highs)->_M_use_count + 1;
            }
          }
        }
        else {
          local_53e8.mipsolver = (HighsMipSolver *)0x0;
          local_53e8.lpsolver._vptr_Highs = (_func_int **)0x0;
        }
        std::vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>>::
        emplace_back<double_const&,double&,std::shared_ptr<HighsBasis_const>&,std::shared_ptr<StabilizerOrbits_const>>
                  ((vector<HighsSearch::NodeData,std::allocator<HighsSearch::NodeData>> *)
                   local_5490._8_8_,&__args->lower_bound,&pNVar5[-1].estimate,&pNVar5[-1].nodeBasis,
                   (shared_ptr<const_StabilizerOrbits> *)&local_53e8);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_53e8.lpsolver._vptr_Highs !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_53e8.lpsolver._vptr_Highs
                    );
        }
        (this->nodestack).
        super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
        super__Vector_impl_data._M_finish[-1].domgchgStackPos =
             (HighsInt)((ulong)((long)pHVar13 - (long)pHVar14) >> 4);
        NVar18 = kBranched;
      }
    }
    return NVar18;
  }
  local_5440 = (double)(int)uVar4;
  local_5428 = (double)(int)(uVar4 - 1);
  localdomain = &this->localdom;
  local_5418 = &this->subrootsol;
  local_53f8._8_4_ = (int)DAT_003c93e0;
  local_53f8._0_8_ = DAT_003c93e0._8_8_;
  local_53f8._12_4_ = DAT_003c93e0._4_4_;
LAB_002e88bb:
  pHVar6 = this->lp;
  if (((2 < pHVar6->status - kUnscaledDualFeasible) && (pHVar6->status != kOptimal)) ||
     ((pHVar6->fractionalints).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (pHVar6->fractionalints).
      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
      super__Vector_impl_data._M_finish)) goto LAB_002e9070;
  iVar29 = (int)pHVar38;
  if (iVar29 < 1) {
    maxSbIters = 0;
  }
  else {
    _Var7._M_head_impl =
         (this->mipsolver->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    lVar19 = (_Var7._M_head_impl)->sb_lp_iterations + this->sblpiterations;
    maxSbIters = ((this->lpiterations + (_Var7._M_head_impl)->total_lp_iterations) -
                  (this->heurlpiterations + lVar19 + (_Var7._M_head_impl)->heuristic_lp_iterations)
                 >> 1) + 100000;
    iVar22 = 0;
    if (lVar19 <= maxSbIters) {
      lVar23 = maxSbIters >> 1;
      if (lVar19 - lVar23 == 0 || lVar19 < lVar23) goto LAB_002e8990;
      iVar22 = (int)(local_5440 -
                    ((double)(lVar19 - lVar23) / (double)(maxSbIters - lVar23)) * local_5428);
      if (iVar29 < iVar22) {
        iVar22 = iVar29;
      }
    }
    this->pseudocost->minreliable = iVar22;
  }
LAB_002e8990:
  dVar15 = HighsLpRelaxation::computeLPDegneracy(pHVar6,localdomain);
  pHVar8 = this->pseudocost;
  pHVar8->degeneracyFactor = dVar15;
  if (10.0 <= dVar15) {
    pHVar8->minreliable = 0;
  }
  local_5478._M_dataplus._M_p =
       (pointer)(this->nodestack).
                super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>.
                _M_impl.super__Vector_impl_data._M_finish[-1].lower_bound;
  local_53e8.mipsolver = (HighsMipSolver *)local_5478._M_dataplus._M_p;
  HVar17 = selectBranchingCandidate(this,maxSbIters,(double *)&local_53e8,(double *)&local_5478);
  pNVar5 = (this->nodestack).
           super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl
           .super__Vector_impl_data._M_finish;
  local_5490._0_8_ = pNVar5[-1].lower_bound;
  if (HVar17 == -1) {
    NVar18 = evaluateNode(this);
    bVar16 = NVar18 != kSubOptimal;
    goto LAB_002e905b;
  }
  pHVar6 = this->lp;
  ppVar9 = (pHVar6->fractionalints).
           super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar29 = ppVar9[HVar17].first;
  lVar19 = (long)iVar29;
  pHVar39 = (HighsDomain *)ppVar9[HVar17].second;
  uVar30 = SUB84(pHVar39,0);
  uVar31 = (undefined4)((ulong)pHVar39 >> 0x20);
  pNVar5[-1].branchingdecision.column = iVar29;
  pNVar5[-1].branching_point = (double)pHVar39;
  switch(this->childselrule) {
  case kUp:
    goto switchD_002e8a50_caseD_0;
  case kDown:
switchD_002e8a50_caseD_1:
    pNVar5[-1].branchingdecision.boundtype = kUpper;
    dVar15 = floor((double)pHVar39);
    pNVar5[-1].branchingdecision.boundval = dVar15;
    pNVar5[-1].other_child_lb = (double)local_5478._M_dataplus._M_p;
    uVar30 = SUB84(local_53e8.mipsolver,0);
    uVar31 = (undefined4)((ulong)local_53e8.mipsolver >> 0x20);
    break;
  case kRootSol:
    dVar15 = ((this->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->epsilon;
    dVar1 = dVar15 + (this->pseudocost->inferencesup).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar19];
    local_5438._8_4_ = SUB84(dVar1,0);
    local_5438._0_8_ =
         dVar15 + (this->pseudocost->inferencesdown).
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar19];
    local_5438._12_4_ = (int)((ulong)dVar1 >> 0x20);
    local_5490._16_8_ = 0.0;
    local_5490._8_8_ = pHVar39;
    local_5458 = (HighsDomain *)floor((double)pHVar39);
    pHVar39 = (HighsDomain *)ceil((double)local_5490._8_8_);
    pdVar10 = (this->subrootsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (pdVar10 ==
        (this->subrootsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (-INFINITY < pNVar5[-1].lp_objective) {
        local_5490._8_8_ = pHVar39;
        std::vector<double,_std::allocator<double>_>::operator=
                  (local_5418,&(pHVar6->lpsolver).solution_.col_value);
        pHVar39 = (HighsDomain *)local_5490._8_8_;
      }
      _Var7._M_head_impl =
           (this->mipsolver->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      pdVar10 = *(pointer *)
                 &((_Var7._M_head_impl)->rootlpsol).
                  super__Vector_base<double,_std::allocator<double>_>;
      auVar32 = local_5438;
      if (pdVar10 != *(pointer *)((long)&(_Var7._M_head_impl)->rootlpsol + 8)) {
        dVar15 = pdVar10[lVar19];
        uVar30 = SUB84(local_5458,0);
        uVar31 = (undefined4)((ulong)local_5458 >> 0x20);
        if ((double)local_5458 <= dVar15) {
          uVar30 = SUB84(dVar15,0);
          uVar31 = (undefined4)((ulong)dVar15 >> 0x20);
          if ((double)pHVar39 < dVar15) {
            uVar30 = SUB84(pHVar39,0);
            uVar31 = (undefined4)((ulong)pHVar39 >> 0x20);
          }
        }
        auVar32._0_8_ =
             (double)local_5438._0_8_ *
             (((double)CONCAT44(uVar31,uVar30) - pNVar5[-1].branching_point) +
             (double)local_53f8._0_8_);
        auVar32._8_8_ =
             (double)local_5438._8_8_ *
             ((pNVar5[-1].branching_point - (double)CONCAT44(uVar31,uVar30)) +
             (double)local_53f8._8_8_);
      }
    }
    else {
      dVar15 = pdVar10[lVar19];
      uVar30 = SUB84(local_5458,0);
      uVar31 = (undefined4)((ulong)local_5458 >> 0x20);
      if ((double)local_5458 <= dVar15) {
        uVar30 = SUB84(dVar15,0);
        uVar31 = (undefined4)((ulong)dVar15 >> 0x20);
        if ((double)pHVar39 < dVar15) {
          uVar30 = SUB84(pHVar39,0);
          uVar31 = (undefined4)((ulong)pHVar39 >> 0x20);
        }
      }
      auVar32._0_8_ =
           (double)local_5438._0_8_ *
           (((double)CONCAT44(uVar31,uVar30) - (double)local_5490._8_8_) + (double)local_53f8._0_8_)
      ;
      auVar32._8_8_ =
           (double)local_5438._8_8_ *
           (((double)local_5490._8_8_ - (double)CONCAT44(uVar31,uVar30)) + (double)local_53f8._8_8_)
      ;
    }
    bVar16 = auVar32._8_8_ +
             ((this->mipsolver->mipdata_)._M_t.
              super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>.
              _M_t.
              super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
              .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->epsilon <
             auVar32._0_8_;
    pHVar37 = local_5458;
    if (!bVar16) {
      pHVar37 = pHVar39;
    }
    puVar26 = (undefined1 *)&local_5478;
    puVar25 = (undefined1 *)&local_53e8;
    if (bVar16) {
      puVar26 = (undefined1 *)&local_53e8;
      puVar25 = (undefined1 *)&local_5478;
    }
    pNVar5[-1].branchingdecision.boundtype = (uint)bVar16;
    pNVar5[-1].branchingdecision.boundval = (double)pHVar37;
    pNVar5[-1].other_child_lb = *(double *)puVar25;
    uVar30 = (undefined4)*(undefined8 *)puVar26;
    uVar31 = (undefined4)((ulong)*(undefined8 *)puVar26 >> 0x20);
    break;
  case kObj:
    pHVar20 = this->mipsolver;
LAB_002e8bcb:
    if (0.0 <= (pHVar20->model_->col_cost_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[lVar19]) goto LAB_002e8be7;
LAB_002e8af4:
    pNVar5[-1].branchingdecision.boundtype = kUpper;
LAB_002e8cc2:
    dVar15 = floor((double)CONCAT44(uVar31,uVar30));
    pNVar5[-1].branchingdecision.boundval = dVar15;
    pNVar5[-1].other_child_lb = (double)local_5478._M_dataplus._M_p;
    uVar30 = SUB84(local_53e8.mipsolver,0);
    uVar31 = (undefined4)((ulong)local_53e8.mipsolver >> 0x20);
    goto LAB_002e8f34;
  case kRandom:
    uVar24 = (this->random).state;
    uVar24 = uVar24 >> 0xc ^ uVar24;
    uVar24 = uVar24 << 0x19 ^ uVar24;
    uVar24 = uVar24 >> 0x1b ^ uVar24;
    (this->random).state = uVar24;
    if (-1 < (long)(((uVar24 & 0xffffffff) + 0xc8497d2a400d9551) *
                   ((uVar24 >> 0x20) + 0x80c8963be3e4c2f3))) goto LAB_002e8af4;
LAB_002e8be7:
    pNVar5[-1].branchingdecision.boundtype = kLower;
    goto LAB_002e8ea4;
  case kBestCost:
    local_5490._8_8_ =
         HighsPseudocost::getPseudocostUp
                   (this->pseudocost,iVar29,(double)pHVar39,
                    ((this->mipsolver->mipdata_)._M_t.
                     super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                     .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol);
    dVar15 = HighsPseudocost::getPseudocostDown
                       (this->pseudocost,iVar29,pNVar5[-1].branching_point,
                        ((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol)
    ;
    if (dVar15 < (double)local_5490._8_8_) {
      pNVar5[-1].branchingdecision.boundtype = kUpper;
      uVar30 = SUB84(pNVar5[-1].branching_point,0);
      uVar31 = (undefined4)((ulong)pNVar5[-1].branching_point >> 0x20);
      goto LAB_002e8cc2;
    }
    pNVar5[-1].branchingdecision.boundtype = kLower;
    uVar30 = SUB84(pNVar5[-1].branching_point,0);
    uVar31 = (undefined4)((ulong)pNVar5[-1].branching_point >> 0x20);
LAB_002e8ea4:
    dVar15 = ceil((double)CONCAT44(uVar31,uVar30));
    pNVar5[-1].branchingdecision.boundval = dVar15;
    pNVar5[-1].other_child_lb = (double)local_53e8.mipsolver;
    uVar30 = SUB84(local_5478._M_dataplus._M_p,0);
    uVar31 = (undefined4)((ulong)local_5478._M_dataplus._M_p >> 0x20);
    goto LAB_002e8f34;
  case kWorstCost:
    local_5438._0_8_ = localdomain;
    pHVar8 = this->pseudocost;
    local_5410 = &pHVar8->cost_total;
    local_5400 = (pHVar8->nsamplesdown).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
    pdVar27 = (pHVar8->pseudocostup).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar19;
    if ((pHVar8->nsamplesup).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar19] == 0) {
      pdVar27 = local_5410;
    }
    local_5490._16_8_ = 0.0;
    local_5490._8_8_ = pHVar39;
    local_5458 = pHVar38;
    local_5420 = ceil((double)pHVar39);
    local_5408 = (local_5420 - (double)local_5490._8_8_) * *pdVar27;
    pdVar27 = (pHVar8->pseudocostdown).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar19;
    if (local_5400[lVar19] == 0) {
      pdVar27 = local_5410;
    }
    dVar15 = floor((double)local_5490._8_8_);
    if (((double)local_5490._8_8_ - dVar15) * *pdVar27 <= local_5408) {
      pNVar5[-1].branchingdecision.boundtype = kLower;
      pNVar5[-1].branchingdecision.boundval = local_5420;
      pNVar5[-1].other_child_lb = (double)local_53e8.mipsolver;
      uVar30 = SUB84(local_5478._M_dataplus._M_p,0);
      uVar31 = (undefined4)((ulong)local_5478._M_dataplus._M_p >> 0x20);
    }
    else {
      pNVar5[-1].branchingdecision.boundtype = kUpper;
      pNVar5[-1].branchingdecision.boundval = dVar15;
      pNVar5[-1].other_child_lb = (double)local_5478._M_dataplus._M_p;
      uVar30 = SUB84(local_53e8.mipsolver,0);
      uVar31 = (undefined4)((ulong)local_53e8.mipsolver >> 0x20);
    }
    local_5490._0_8_ = CONCAT44(uVar31,uVar30);
    localdomain = (HighsDomain *)local_5438._0_8_;
    pHVar38 = local_5458;
    goto LAB_002e8f3c;
  case kDisjunction:
    pHVar20 = this->mipsolver;
    _Var7._M_head_impl =
         (pHVar20->mipdata_)._M_t.
         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
         super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
    lVar23 = *(long *)((long)((NodeSetArray *)((long)&(_Var7._M_head_impl)->nodequeue + 0x40))->_M_t
                       + 0x30 + lVar19 * 0x38);
    lVar11 = *(long *)((long)((NodeSetArray *)((long)&(_Var7._M_head_impl)->nodequeue + 0x48))->_M_t
                       + 0x30 + lVar19 * 0x38);
    if (lVar23 <= lVar11) {
      if (lVar11 <= lVar23) goto LAB_002e8bcb;
      goto switchD_002e8a50_caseD_1;
    }
    goto switchD_002e8a50_caseD_0;
  case kHybridInferenceCost:
    local_5458 = (HighsDomain *)
                 (this->pseudocost->inferencesup).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar19];
    _Stack_5450._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_5490._16_8_ = 0.0;
    local_5490._8_8_ = pHVar39;
    dVar15 = HighsPseudocost::getPseudocostUp
                       (this->pseudocost,iVar29,(double)pHVar39,
                        ((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol)
    ;
    local_5438._8_4_ = extraout_XMM0_Dc;
    local_5438._0_8_ = dVar15;
    local_5438._12_4_ = extraout_XMM0_Dd;
    _Stack_5450._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (this->pseudocost->inferencesdown).super__Vector_base<double,_std::allocator<double>_>.
         _M_impl.super__Vector_impl_data._M_start[lVar19];
    dVar15 = HighsPseudocost::getPseudocostDown
                       (this->pseudocost,iVar29,pNVar5[-1].branching_point,
                        ((this->mipsolver->mipdata_)._M_t.
                         super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>
                         .super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl)->feastol)
    ;
    auVar33._0_8_ = (double)local_5458 + 1.0;
    auVar33._8_8_ = (double)_Stack_5450._M_pi + 1.0;
    auVar34._8_4_ = SUB84(dVar15,0);
    auVar34._0_8_ = local_5438._0_8_;
    auVar34._12_4_ = (int)((ulong)dVar15 >> 0x20);
    auVar34 = divpd(auVar33,auVar34);
    bVar16 = auVar34._8_8_ <= auVar34._0_8_;
    if (bVar16) {
      dVar15 = ceil((double)local_5490._8_8_);
      uVar30 = SUB84(dVar15,0);
      uVar31 = (undefined4)((ulong)dVar15 >> 0x20);
      puVar25 = (undefined1 *)&local_53e8;
      puVar26 = (undefined1 *)&local_5478;
    }
    else {
      dVar15 = floor((double)local_5490._8_8_);
      uVar30 = SUB84(dVar15,0);
      uVar31 = (undefined4)((ulong)dVar15 >> 0x20);
      puVar25 = (undefined1 *)&local_5478;
      puVar26 = (undefined1 *)&local_53e8;
    }
    pNVar5[-1].branchingdecision.boundtype = (uint)!bVar16;
    pNVar5[-1].branchingdecision.boundval = (double)CONCAT44(uVar31,uVar30);
    pNVar5[-1].other_child_lb = *(double *)puVar25;
    uVar30 = (undefined4)*(undefined8 *)puVar26;
    uVar31 = (undefined4)((ulong)*(undefined8 *)puVar26 >> 0x20);
LAB_002e8f34:
    local_5490._0_8_ = CONCAT44(uVar31,uVar30);
LAB_002e8f3c:
    bVar16 = false;
    NVar18 = kBranched;
    goto LAB_002e905b;
  default:
    goto switchD_002e8a50_default;
  }
LAB_002e9053:
  local_5490._0_8_ = CONCAT44(uVar31,uVar30);
switchD_002e8a50_default:
  NVar18 = kBranched;
  bVar16 = false;
LAB_002e905b:
  if ((!bVar16) ||
     ((this->nodestack).
      super__Vector_base<HighsSearch::NodeData,_std::allocator<HighsSearch::NodeData>_>._M_impl.
      super__Vector_impl_data._M_finish[-1].opensubtrees != '\x02')) goto LAB_002e9070;
  goto LAB_002e88bb;
switchD_002e8a50_caseD_0:
  pNVar5[-1].branchingdecision.boundtype = kLower;
  dVar15 = ceil((double)pHVar39);
  pNVar5[-1].branchingdecision.boundval = dVar15;
  pNVar5[-1].other_child_lb = (double)local_53e8.mipsolver;
  uVar30 = SUB84(local_5478._M_dataplus._M_p,0);
  uVar31 = (undefined4)((ulong)local_5478._M_dataplus._M_p >> 0x20);
  goto LAB_002e9053;
}

Assistant:

HighsSearch::NodeResult HighsSearch::branch() {
  assert(localdom.getChangedCols().empty());

  assert(nodestack.back().opensubtrees == 2);
  nodestack.back().branchingdecision.column = -1;
  inbranching = true;

  HighsInt minrel = pseudocost.getMinReliable();
  double childLb = getCurrentLowerBound();
  NodeResult result = NodeResult::kOpen;
  while (nodestack.back().opensubtrees == 2 &&
         lp->scaledOptimal(lp->getStatus()) &&
         !lp->getFractionalIntegers().empty()) {
    int64_t sbmaxiters = 0;
    if (minrel > 0) {
      int64_t sbiters = getStrongBranchingLpIterations();
      sbmaxiters =
          100000 + ((getTotalLpIterations() - getHeuristicLpIterations() -
                     getStrongBranchingLpIterations()) >>
                    1);
      if (sbiters > sbmaxiters) {
        pseudocost.setMinReliable(0);
      } else if (sbiters > (sbmaxiters >> 1)) {
        double reductionratio = (sbiters - (sbmaxiters >> 1)) /
                                (double)(sbmaxiters - (sbmaxiters >> 1));

        HighsInt minrelreduced = int(minrel - reductionratio * (minrel - 1));
        pseudocost.setMinReliable(std::min(minrel, minrelreduced));
      }
    }

    double degeneracyFac = lp->computeLPDegneracy(localdom);
    pseudocost.setDegeneracyFactor(degeneracyFac);
    if (degeneracyFac >= 10.0) pseudocost.setMinReliable(0);
    // if (!mipsolver.submip)
    //  printf("selecting branching cand with minrel=%d\n",
    //         pseudocost.getMinReliable());
    double downNodeLb = getCurrentLowerBound();
    double upNodeLb = getCurrentLowerBound();
    HighsInt branchcand =
        selectBranchingCandidate(sbmaxiters, downNodeLb, upNodeLb);
    // if (!mipsolver.submip)
    //   printf("branching cand returned as %d\n", branchcand);
    NodeData& currnode = nodestack.back();
    childLb = currnode.lower_bound;
    if (branchcand != -1) {
      auto branching = lp->getFractionalIntegers()[branchcand];
      currnode.branchingdecision.column = branching.first;
      currnode.branching_point = branching.second;

      HighsInt col = branching.first;

      switch (childselrule) {
        case ChildSelectionRule::kUp:
          currnode.branchingdecision.boundtype = HighsBoundType::kLower;
          currnode.branchingdecision.boundval =
              std::ceil(currnode.branching_point);
          currnode.other_child_lb = downNodeLb;
          childLb = upNodeLb;
          break;
        case ChildSelectionRule::kDown:
          currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
          currnode.branchingdecision.boundval =
              std::floor(currnode.branching_point);
          currnode.other_child_lb = upNodeLb;
          childLb = downNodeLb;
          break;
        case ChildSelectionRule::kRootSol: {
          double downPrio = pseudocost.getAvgInferencesDown(col) +
                            mipsolver.mipdata_->epsilon;
          double upPrio =
              pseudocost.getAvgInferencesUp(col) + mipsolver.mipdata_->epsilon;
          double downVal = std::floor(currnode.branching_point);
          double upVal = std::ceil(currnode.branching_point);
          if (!subrootsol.empty()) {
            double rootsol = subrootsol[col];
            if (rootsol < downVal)
              rootsol = downVal;
            else if (rootsol > upVal)
              rootsol = upVal;

            upPrio *= (1.0 + (currnode.branching_point - rootsol));
            downPrio *= (1.0 + (rootsol - currnode.branching_point));

          } else {
            if (currnode.lp_objective != -kHighsInf)
              subrootsol = lp->getSolution().col_value;
            if (!mipsolver.mipdata_->rootlpsol.empty()) {
              double rootsol = mipsolver.mipdata_->rootlpsol[col];
              if (rootsol < downVal)
                rootsol = downVal;
              else if (rootsol > upVal)
                rootsol = upVal;

              upPrio *= (1.0 + (currnode.branching_point - rootsol));
              downPrio *= (1.0 + (rootsol - currnode.branching_point));
            }
          }
          if (upPrio + mipsolver.mipdata_->epsilon >= downPrio) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval = upVal;
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval = downVal;
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        }
        case ChildSelectionRule::kObj:
          if (mipsolver.colCost(col) >= 0) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        case ChildSelectionRule::kRandom:
          if (random.bit()) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        case ChildSelectionRule::kBestCost: {
          if (pseudocost.getPseudocostUp(col, currnode.branching_point,
                                         mipsolver.mipdata_->feastol) >
              pseudocost.getPseudocostDown(col, currnode.branching_point,
                                           mipsolver.mipdata_->feastol)) {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          }
          break;
        }
        case ChildSelectionRule::kWorstCost:
          if (pseudocost.getPseudocostUp(col, currnode.branching_point) >=
              pseudocost.getPseudocostDown(col, currnode.branching_point)) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
          break;
        case ChildSelectionRule::kDisjunction: {
          int64_t numnodesup;
          int64_t numnodesdown;
          numnodesup = mipsolver.mipdata_->nodequeue.numNodesUp(col);
          numnodesdown = mipsolver.mipdata_->nodequeue.numNodesDown(col);
          if (numnodesup > numnodesdown) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval =
                std::ceil(currnode.branching_point);
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else if (numnodesdown > numnodesup) {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval =
                std::floor(currnode.branching_point);
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          } else {
            if (mipsolver.colCost(col) >= 0) {
              currnode.branchingdecision.boundtype = HighsBoundType::kLower;
              currnode.branchingdecision.boundval =
                  std::ceil(currnode.branching_point);
              currnode.other_child_lb = downNodeLb;
              childLb = upNodeLb;
            } else {
              currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
              currnode.branchingdecision.boundval =
                  std::floor(currnode.branching_point);
              currnode.other_child_lb = upNodeLb;
              childLb = downNodeLb;
            }
          }
          break;
        }
        case ChildSelectionRule::kHybridInferenceCost: {
          double upVal = std::ceil(currnode.branching_point);
          double downVal = std::floor(currnode.branching_point);
          double upScore =
              (1 + pseudocost.getAvgInferencesUp(col)) /
              pseudocost.getPseudocostUp(col, currnode.branching_point,
                                         mipsolver.mipdata_->feastol);
          double downScore =
              (1 + pseudocost.getAvgInferencesDown(col)) /
              pseudocost.getPseudocostDown(col, currnode.branching_point,
                                           mipsolver.mipdata_->feastol);

          if (upScore >= downScore) {
            currnode.branchingdecision.boundtype = HighsBoundType::kLower;
            currnode.branchingdecision.boundval = upVal;
            currnode.other_child_lb = downNodeLb;
            childLb = upNodeLb;
          } else {
            currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
            currnode.branchingdecision.boundval = downVal;
            currnode.other_child_lb = upNodeLb;
            childLb = downNodeLb;
          }
        }
      }
      result = NodeResult::kBranched;
      break;
    }

    assert(!localdom.getChangedCols().empty());
    result = evaluateNode();
    if (result == NodeResult::kSubOptimal) break;
  }
  inbranching = false;
  NodeData& currnode = nodestack.back();
  pseudocost.setMinReliable(minrel);
  pseudocost.setDegeneracyFactor(1.0);

  assert(currnode.opensubtrees == 2 || currnode.opensubtrees == 0);

  if (currnode.opensubtrees != 2 || result == NodeResult::kSubOptimal)
    return result;

  if (currnode.branchingdecision.column == -1) {
    double bestscore = -1.0;
    // solution branching failed, so choose any integer variable to branch
    // on in case we have a different solution status could happen due to a
    // fail in the LP solution process
    pseudocost.setDegeneracyFactor(1e6);

    for (HighsInt i : mipsolver.mipdata_->integral_cols) {
      if (localdom.col_upper_[i] - localdom.col_lower_[i] < 0.5) continue;

      double fracval;
      if (localdom.col_lower_[i] != -kHighsInf &&
          localdom.col_upper_[i] != kHighsInf)
        fracval = std::floor(0.5 * (localdom.col_lower_[i] +
                                    localdom.col_upper_[i] + 0.5)) +
                  0.5;
      if (localdom.col_lower_[i] != -kHighsInf)
        fracval = localdom.col_lower_[i] + 0.5;
      else if (localdom.col_upper_[i] != kHighsInf)
        fracval = localdom.col_upper_[i] - 0.5;
      else
        fracval = 0.5;

      double score = pseudocost.getScore(i, fracval);
      assert(score >= 0.0);

      if (score > bestscore) {
        bestscore = score;
        bool branchUpwards;
        double cost = lp->unscaledDualFeasible(lp->getStatus())
                          ? lp->getSolution().col_dual[i]
                          : mipsolver.colCost(i);
        if (std::fabs(cost) > mipsolver.mipdata_->feastol &&
            getCutoffBound() < kHighsInf) {
          // branch in direction of worsening cost first in case the column has
          // cost and we do have an upper bound
          branchUpwards = cost > 0;
        } else if (pseudocost.getAvgInferencesUp(i) >
                   pseudocost.getAvgInferencesDown(i) +
                       mipsolver.mipdata_->feastol) {
          // column does not have (reduced) cost above tolerance so branch in
          // direction of more inferences
          branchUpwards = true;
        } else if (pseudocost.getAvgInferencesUp(i) <
                   pseudocost.getAvgInferencesDown(i) -
                       mipsolver.mipdata_->feastol) {
          branchUpwards = false;
        } else {
          // number of inferences give a tie, so we branch in the direction that
          // does have a less recent domain change to avoid branching the same
          // integer column into the same direction over and over
          HighsInt colLowerPos;
          HighsInt colUpperPos;
          localdom.getColLowerPos(i, localdom.getNumDomainChanges(),
                                  colLowerPos);
          localdom.getColUpperPos(i, localdom.getNumDomainChanges(),
                                  colUpperPos);
          branchUpwards = colLowerPos <= colUpperPos;
        }
        if (branchUpwards) {
          double upval = std::ceil(fracval);
          currnode.branching_point = upval;
          currnode.branchingdecision.boundtype = HighsBoundType::kLower;
          currnode.branchingdecision.column = i;
          currnode.branchingdecision.boundval = upval;
        } else {
          double downval = std::floor(fracval);
          currnode.branching_point = downval;
          currnode.branchingdecision.boundtype = HighsBoundType::kUpper;
          currnode.branchingdecision.column = i;
          currnode.branchingdecision.boundval = downval;
        }
      }
    }

    pseudocost.setDegeneracyFactor(1);
  }

  if (currnode.branchingdecision.column == -1) {
    if (lp->getStatus() == HighsLpRelaxation::Status::kOptimal) {
      // if the LP was solved to optimality and all columns are fixed, then this
      // particular assignment is not feasible or has a worse objective in the
      // original space, otherwise the node would not be open. Hence we prune
      // this particular assignment
      currnode.opensubtrees = 0;
      result = NodeResult::kLpInfeasible;
      return result;
    }
    lp->setIterationLimit();

    // create a fresh LP only with model rows since all integer columns are
    // fixed, the cutting planes are not required and the LP could not be solved
    // so we want to make it as easy as possible
    HighsLpRelaxation lpCopy(mipsolver);
    lpCopy.loadModel();
    lpCopy.getLpSolver().changeColsBounds(0, mipsolver.numCol() - 1,
                                          localdom.col_lower_.data(),
                                          localdom.col_upper_.data());
    // temporarily use the fresh LP for the HighsSearch class
    HighsLpRelaxation* tmpLp = &lpCopy;
    std::swap(tmpLp, lp);

    // reevaluate the node with LP presolve enabled
    lp->getLpSolver().setOptionValue("presolve", kHighsOnString);
    result = evaluateNode();

    if (result == NodeResult::kOpen) {
      // LP still not solved, reevaluate with primal simplex
      lp->getLpSolver().clearSolver();
      lp->getLpSolver().setOptionValue("simplex_strategy",
                                       kSimplexStrategyPrimal);
      result = evaluateNode();
      lp->getLpSolver().setOptionValue("simplex_strategy",
                                       kSimplexStrategyDual);
      if (result == NodeResult::kOpen) {
        // LP still not solved, reevaluate with IPM instead of simplex
        lp->getLpSolver().clearSolver();
        lp->getLpSolver().setOptionValue("solver", "ipm");
        result = evaluateNode();

        if (result == NodeResult::kOpen) {
          highsLogUser(mipsolver.options_mip_->log_options,
                       HighsLogType::kWarning,
                       "Failed to solve node with all integer columns "
                       "fixed. Declaring node infeasible.\n");
          // LP still not solved, give up and declare as infeasible
          currnode.opensubtrees = 0;
          result = NodeResult::kLpInfeasible;
        }
      }
    }

    // restore old lp relaxation
    std::swap(tmpLp, lp);

    return result;
  }

  // finally open a new node with the branching decision added
  // and remember that we have one open subtree left
  HighsInt domchgPos = localdom.getDomainChangeStack().size();

  bool passStabilizerToChildNode =
      orbitsValidInChildNode(currnode.branchingdecision);
  localdom.changeBound(currnode.branchingdecision);
  currnode.opensubtrees = 1;
  nodestack.emplace_back(
      std::max(childLb, currnode.lower_bound), currnode.estimate,
      currnode.nodeBasis,
      passStabilizerToChildNode ? currnode.stabilizerOrbits : nullptr);
  nodestack.back().domgchgStackPos = domchgPos;

  return NodeResult::kBranched;
}